

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComponent.cpp
# Opt level: O2

void __thiscall
RemoveVCProcessTest_testMaterialRemove_Test::RemoveVCProcessTest_testMaterialRemove_Test
          (RemoveVCProcessTest_testMaterialRemove_Test *this)

{
  RemoveVCProcessTest::RemoveVCProcessTest(&this->super_RemoveVCProcessTest);
  (this->super_RemoveVCProcessTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_007f21f0;
  return;
}

Assistant:

TEST_F(RemoveVCProcessTest, testMaterialRemove)
{
    piProcess->SetDeleteFlags(aiComponent_MATERIALS);
    piProcess->Execute(pScene);

    // there should be one default material now ...
    EXPECT_TRUE(1 == pScene->mNumMaterials &&
        pScene->mMeshes[0]->mMaterialIndex == 0 &&
        pScene->mMeshes[1]->mMaterialIndex == 0);
    EXPECT_EQ(0U, pScene->mFlags);
}